

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O3

void __thiscall Symbol_table::set_value(Symbol_table *this,string *s,double d)

{
  pointer pVVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  runtime_error *prVar3;
  pointer pVVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  double local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pVVar4 = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
           super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pVVar1 = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
           super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  local_50 = d;
  if (pVVar4 != pVVar1) {
    __s2 = (s->_M_dataplus)._M_p;
    __n = s->_M_string_length;
    do {
      if ((pVVar4->name)._M_string_length == __n) {
        if (__n == 0) {
LAB_00104994:
          if (pVVar4->is_const == false) {
            pVVar4->value = local_50;
            return;
          }
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"value of constant cannot be changed","");
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,(string *)&local_70);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar2 = bcmp((pVVar4->name)._M_dataplus._M_p,__s2,__n);
        if (iVar2 == 0) goto LAB_00104994;
      }
      pVVar4 = pVVar4 + 1;
    } while (pVVar4 != pVVar1);
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"set: undefined name ","");
  std::operator+(&local_70,&local_48,s);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,(string *)&local_70);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Symbol_table::set_value(const string& s, double d)
{
	for (auto&& var : var_table)
		if (var.name == s)
		{
			if (var.is_const)
				error("value of constant cannot be changed");
			var.value = d;
			return;
		}
	error("set: undefined name ", s);
}